

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O0

int __thiscall
adios2::format::DataManSerializer::GetData<std::__cxx11::string>
          (DataManSerializer *this,string *outputData,string *varName,Dims *varStart,Dims *varCount,
          size_t step,MemorySpace varMemSpace,Dims *varMemStart,Dims *varMemCount)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  undefined8 uVar4;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>
  __rhs;
  char *pcVar5;
  string *in_RSI;
  DataManVar *j;
  iterator __end2;
  iterator __begin2;
  element_type *__range2;
  char *input_data;
  iterator *i;
  lock_guard<std::mutex> l;
  DmvVecPtr vec;
  ScopedTimer __var2677;
  unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
  *in_stack_fffffffffffffee8;
  __shared_ptr_access<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  allocator local_d1;
  string local_d0 [32];
  reference local_b0;
  DataManVar *local_a8;
  __normal_iterator<adios2::format::DataManVar_*,_std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
  local_a0;
  element_type *local_98;
  unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
  *local_90;
  uint local_84;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>
  local_80;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>
  local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false>
  *local_70;
  string *local_18;
  int local_4;
  
  local_18 = in_RSI;
  if ((GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
       ::__var677 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                   ::__var677), iVar3 != 0)) {
    uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                ,
                                "int adios2::format::DataManSerializer::GetData(std::string *, const std::string &, const Dims &, const Dims &, const size_t, const MemorySpace, const Dims &, const Dims &)"
                                ,0x2a5);
    GetData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    __var677 = (void *)ps_timer_create_(uVar4);
    in_stack_ffffffffffffff10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         GetData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
         __var677;
    __cxa_guard_release(&GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                         ::__var677);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::
  shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
  ::shared_ptr((shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
                *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffef0,
             (mutex_type *)in_stack_fffffffffffffee8);
  __rhs._M_cur = (__node_type *)
                 std::
                 unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
                 ::find(in_stack_fffffffffffffee8,(key_type *)0xdd4930);
  local_78._M_cur = __rhs._M_cur;
  local_70 = &local_78;
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
       ::end(in_stack_fffffffffffffee8);
  bVar1 = std::__detail::operator==(&local_78,&local_80);
  if (bVar1) {
    local_4 = -1;
  }
  else {
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>,_false,_false>
                  *)0xdd4a1b);
    std::
    shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
    ::operator=((shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
                 *)in_stack_fffffffffffffef0,
                (shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
                 *)in_stack_fffffffffffffee8);
  }
  local_84 = (uint)bVar1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xdd4a47);
  if (local_84 == 0) {
    bVar1 = std::operator==((shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
                             *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (bVar1) {
      local_4 = -2;
      local_84 = 1;
    }
    else {
      local_90 = (unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
                  *)0x0;
      local_98 = std::
                 __shared_ptr_access<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(in_stack_fffffffffffffef0);
      local_a0._M_current =
           (DataManVar *)
           std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>::
           begin((vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_> *)
                 in_stack_fffffffffffffee8);
      local_a8 = (DataManVar *)
                 std::
                 vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>::
                 end((vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>
                      *)in_stack_fffffffffffffee8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<adios2::format::DataManVar_*,_std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
                                 *)in_stack_fffffffffffffef0,
                                (__normal_iterator<adios2::format::DataManVar_*,_std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
                                 *)in_stack_fffffffffffffee8), bVar1) {
        local_b0 = __gnu_cxx::
                   __normal_iterator<adios2::format::DataManVar_*,_std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
                   ::operator*(&local_a0);
        _Var2 = std::operator==(in_stack_ffffffffffffff10,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__rhs._M_cur);
        if ((_Var2) &&
           (bVar1 = std::operator==((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)
                                    in_stack_fffffffffffffef0,in_stack_fffffffffffffee8), !bVar1)) {
          std::
          __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0xdd4b46);
          pcVar5 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0xdd4b4e);
          in_stack_fffffffffffffee8 =
               (unordered_map<unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>_>_>_>
                *)(pcVar5 + local_b0->position);
          in_stack_fffffffffffffef0 =
               (__shared_ptr_access<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_b0->size;
          local_90 = in_stack_fffffffffffffee8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_d0,(char *)in_stack_fffffffffffffee8,(ulong)in_stack_fffffffffffffef0,
                     &local_d1);
          std::__cxx11::string::operator=(local_18,local_d0);
          std::__cxx11::string::~string(local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        }
        __gnu_cxx::
        __normal_iterator<adios2::format::DataManVar_*,_std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
        ::operator++(&local_a0);
      }
      local_4 = 0;
      local_84 = 1;
    }
  }
  std::
  shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
  ::~shared_ptr((shared_ptr<std::vector<adios2::format::DataManVar,_std::allocator<adios2::format::DataManVar>_>_>
                 *)0xdd4c37);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffffef0);
  return local_4;
}

Assistant:

int DataManSerializer::GetData(std::string *outputData, const std::string &varName,
                               const Dims &varStart, const Dims &varCount, const size_t step,
                               const MemorySpace varMemSpace, const Dims &varMemStart,
                               const Dims &varMemCount)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    DmvVecPtr vec = nullptr;

    {
        std::lock_guard<std::mutex> l(m_DataManVarMapMutex);
        const auto &i = m_DataManVarMap.find(step);
        if (i == m_DataManVarMap.end())
        {
            return -1; // step not found
        }
        else
        {
            vec = i->second;
        }
    }

    if (vec == nullptr)
    {
        return -2; // step found but variable not found
    }

    char *input_data = nullptr;

    for (const auto &j : *vec)
    {
        if (j.name == varName)
        {
            if (j.buffer == nullptr)
            {
                continue;
            }
            else
            {
                input_data = reinterpret_cast<char *>(j.buffer->data());
            }

            input_data += j.position;

            *outputData = std::string(input_data, j.size);
        }
    }
    return 0;
}